

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::MergedDescriptorDatabase::MergedDescriptorDatabase
          (MergedDescriptorDatabase *this,DescriptorDatabase *source1,DescriptorDatabase *source2)

{
  DescriptorDatabase *local_20;
  DescriptorDatabase *source2_local;
  DescriptorDatabase *source1_local;
  MergedDescriptorDatabase *this_local;
  
  local_20 = source2;
  source2_local = source1;
  source1_local = &this->super_DescriptorDatabase;
  DescriptorDatabase::DescriptorDatabase(&this->super_DescriptorDatabase);
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__MergedDescriptorDatabase_008ebeb8;
  std::
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  ::vector(&this->sources_);
  std::
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  ::push_back(&this->sources_,&source2_local);
  std::
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  ::push_back(&this->sources_,&local_20);
  return;
}

Assistant:

MergedDescriptorDatabase::MergedDescriptorDatabase(
    DescriptorDatabase* source1, DescriptorDatabase* source2) {
  sources_.push_back(source1);
  sources_.push_back(source2);
}